

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaSimple.c
# Opt level: O0

Pla_Man_t * Pla_ManFxPrepare(int nVars)

{
  int iVar1;
  word *pOn;
  Pla_Man_t *p_00;
  int local_430;
  int Lit;
  int k;
  int i;
  word *pCube;
  word Cube;
  Vec_Wrd_t *vSop;
  Vec_Bit_t *vFunc;
  char Buffer [1000];
  Pla_Man_t *p;
  int nVars_local;
  
  vSop = (Vec_Wrd_t *)Pla_ManPrimesTable(nVars);
  pOn = (word *)Vec_BitArray((Vec_Bit_t *)vSop);
  Cube = (word)Pla_ManFxMinimize(pOn,nVars);
  sprintf((char *)&vFunc,"primes%02d",(ulong)(uint)nVars);
  iVar1 = Vec_WrdSize((Vec_Wrd_t *)Cube);
  p_00 = Pla_ManAlloc((char *)&vFunc,nVars,1,iVar1);
  iVar1 = Pla_ManCubeNum(p_00);
  Vec_WecInit(&p_00->vCubeLits,iVar1);
  iVar1 = Pla_ManInNum(p_00);
  Vec_WecInit(&p_00->vOccurs,iVar1 << 1);
  for (Lit = 0; iVar1 = Vec_WrdSize((Vec_Wrd_t *)Cube), Lit < iVar1; Lit = Lit + 1) {
    pCube = (word *)Vec_WrdEntry((Vec_Wrd_t *)Cube,Lit);
    for (local_430 = 0; local_430 < nVars; local_430 = local_430 + 1) {
      iVar1 = Pla_CubeGetLit((word *)&pCube,local_430);
      if (iVar1 != 0) {
        iVar1 = Abc_Var2Lit(local_430,(uint)(iVar1 == 1));
        Vec_WecPush(&p_00->vCubeLits,Lit,iVar1);
        Vec_WecPush(&p_00->vOccurs,iVar1,Lit);
      }
    }
  }
  Vec_BitFree((Vec_Bit_t *)vSop);
  Vec_WrdFree((Vec_Wrd_t *)Cube);
  return p_00;
}

Assistant:

Pla_Man_t * Pla_ManFxPrepare( int nVars )
{
    Pla_Man_t * p; char Buffer[1000]; 
    Vec_Bit_t * vFunc = Pla_ManPrimesTable( nVars );
    Vec_Wrd_t * vSop = Pla_ManFxMinimize( (word *)Vec_BitArray(vFunc), nVars );
    word Cube, * pCube = &Cube; int i, k, Lit;
    sprintf( Buffer, "primes%02d", nVars );
    p = Pla_ManAlloc( Buffer, nVars, 1, Vec_WrdSize(vSop) );
    Vec_WecInit( &p->vCubeLits, Pla_ManCubeNum(p) );
    Vec_WecInit( &p->vOccurs, 2*Pla_ManInNum(p) );
    Vec_WrdForEachEntry( vSop, Cube, i )
        Pla_CubeForEachLit( nVars, pCube, Lit, k )
            if ( Lit != PLA_LIT_DASH )
            {
                Lit = Abc_Var2Lit( k, Lit == PLA_LIT_ZERO );
                Vec_WecPush( &p->vCubeLits, i, Lit );
                Vec_WecPush( &p->vOccurs, Lit, i );
            }
    Vec_BitFree( vFunc );
    Vec_WrdFree( vSop );
    return p;
}